

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocmap.h
# Opt level: O2

void __thiscall allocmap::markused(allocmap *this,uint32_t ofs,uint32_t size,char *tag)

{
  int iVar1;
  iterator __position;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_> _Var2;
  undefined8 *puVar3;
  _Rb_tree_color _Var4;
  uint uVar5;
  _Rb_tree_color _Var6;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar7;
  uint32_t ofs_local;
  pair<const_unsigned_int,_unsigned_int> local_30;
  
  if (size != 0) {
    ofs_local = ofs;
    __position = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::upper_bound((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)this,&ofs_local);
    if (__position._M_node == (this->_m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      local_30.first = ofs_local;
      local_30.second = size;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                  *)this,&local_30);
    }
    else {
      _Var4 = ofs + size;
      _Var2._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
      iVar1 = *(int *)&_Var2._M_node[1].field_0x4;
      uVar5 = iVar1 + _Var2._M_node[1]._M_color;
      if (uVar5 == ofs_local) {
        if ((_Rb_tree_header *)__position._M_node != &(this->_m)._M_t._M_impl.super__Rb_tree_header)
        {
          if (__position._M_node[1]._M_color < _Var4) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)uVar5,(ulong)_Var4
                  );
            iVar1 = *(int *)&_Var2._M_node[1].field_0x4;
          }
        }
        *(uint32_t *)&_Var2._M_node[1].field_0x4 = iVar1 + size;
      }
      else if (ofs_local < uVar5) {
        printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs_local,(ulong)_Var4
              );
      }
      else {
        if ((_Rb_tree_header *)__position._M_node != &(this->_m)._M_t._M_impl.super__Rb_tree_header)
        {
          if (__position._M_node[1]._M_color < _Var4) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs_local,
                   (ulong)_Var4);
          }
        }
        local_30.first = ofs_local;
        local_30.second = size;
        pVar7 = std::
                _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                ::_M_insert_unique<std::pair<unsigned_int_const,unsigned_int>>
                          ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                            *)this,&local_30);
        _Var2 = pVar7.first._M_node;
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "failed to free";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
      }
      if ((_Rb_tree_header *)__position._M_node != &(this->_m)._M_t._M_impl.super__Rb_tree_header) {
        _Var6 = *(int *)&_Var2._M_node[1].field_0x4 + _Var2._M_node[1]._M_color;
        if (_Var6 == __position._M_node[1]._M_color) {
          *(int *)&_Var2._M_node[1].field_0x4 =
               *(int *)&_Var2._M_node[1].field_0x4 + *(int *)&__position._M_node[1].field_0x4;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)this,__position);
        }
        else if (__position._M_node[1]._M_color < _Var6) {
          printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n",(ulong)ofs_local,
                 (ulong)_Var4);
        }
      }
    }
  }
  return;
}

Assistant:

void markused(uint32_t ofs, uint32_t size, const char *tag)
    {
//        printf("mark %08x-%08x (%8x): %s\n", ofs, ofs+size, size, tag);
        if (size==0)
            return;
        uint32_t end= ofs+size;
        //printf("used(%08x-%08x) %s\n", ofs, end, tag);

        auto i= _m.upper_bound(ofs);
        if (i==_m.begin()) {
            // first item
            _m.insert(allocmap_t::value_type(ofs, size));
            return;
        }
        auto next= i;
        --i;
        // now  i->first <= ofs  < (i+1)->first

        if (endofs(i)==ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //                 ofs...end
            if (next!=_m.end() && end > next->first)
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            i->second += size;
        }
        else if (endofs(i) > ofs) {
            //  --------<.......>----------<....>
            //          i      ie
            //               ofs...end
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
        else {
            //  --------<.......>----------<....>
            //          i      ie
            //                    ofs...end
            if (next!=_m.end() && end > next->first) {
                //  --------<.......>----------<......>
                //          i      ie
                //                    ofs........end
                
                printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
                //throw "overlap";
            }
            auto ins= _m.insert(allocmap_t::value_type(ofs, size));
            if (!ins.second)
                throw "failed to free";
            i= ins.first;

            next= i; ++next;
        }

        if (next==_m.end())
            return;

        // now check if we need to merge with 'next'
        if (endofs(i) == next->first) {
            i->second += next->second;
            _m.erase(next);
        }
        else if (endofs(i) > next->first) {
            printf("overlap: mark(%08x-%08x) / i=%08x-%08x, n=%08x-%08x\n", ofs, end, i->first, endofs(i), next->first, endofs(next));
            //throw "overlap";
        }
    }